

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O1

SourceBase * __thiscall
COLLADASaxFWL::MeshLoader::getSourceByInputSemanticFromVertices(MeshLoader *this,Semantic *semantic)

{
  size_t sVar1;
  SourceBase *pSVar2;
  InputUnshared *pIVar3;
  size_t sVar4;
  String sourceId;
  URI positionsInputSource;
  String local_120;
  URI local_100;
  
  sVar1 = (this->mVerticesInputs).mInputArray.mCount;
  if (sVar1 != 0) {
    sVar4 = 0;
    do {
      pIVar3 = (this->mVerticesInputs).mInputArray.mData[sVar4];
      if (pIVar3->mSemantic == *semantic) goto LAB_00826e9e;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  pIVar3 = (InputUnshared *)0x0;
LAB_00826e9e:
  if (pIVar3 == (InputUnshared *)0x0) {
    pSVar2 = (SourceBase *)0x0;
  }
  else {
    COLLADABU::URI::URI(&local_100,&pIVar3->mSource,false);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_100.mFragment._M_dataplus._M_p,
               local_100.mFragment._M_dataplus._M_p + local_100.mFragment._M_string_length);
    pSVar2 = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    COLLADABU::URI::~URI(&local_100);
  }
  return pSVar2;
}

Assistant:

const SourceBase* MeshLoader::getSourceByInputSemanticFromVertices ( const InputSemantic::Semantic& semantic ) const
    {
        // Check if the input element with the semantic is a vertex element.
        const InputUnshared* positionsInput = getVertexInputBySemantic ( semantic );
        if ( positionsInput == 0 ) return 0;

        // Get the source element with the uri of the input element.
        COLLADABU::URI positionsInputSource = positionsInput->getSource ();
        String sourceId = positionsInputSource.getFragment ();

        return getSourceById ( sourceId );
    }